

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opl.cpp
# Opt level: O2

void __thiscall DBOPL::WriteReg(DBOPL *this,int idx,int val)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  op_type *poVar7;
  byte bVar8;
  Bitu BVar9;
  DBOPL *pDVar10;
  Bitu regbase;
  uint uVar11;
  double dVar12;
  
  bVar8 = (byte)val;
  this->adlibreg[idx] = bVar8;
  uVar3 = (uint)idx >> 4 & 0xf;
  if (uVar3 < 0x10) {
    uVar11 = idx & 0x100;
    switch(uVar3) {
    case 0:
      if (idx == 0x104) {
        this->op[0].is_4op = (bool)(bVar8 & 1);
        this->op[3].is_4op_attached = (bool)(bVar8 & 1);
        bVar2 = (bool)(bVar8 >> 1 & 1);
        this->op[1].is_4op = bVar2;
        this->op[4].is_4op_attached = bVar2;
        bVar2 = (bool)(bVar8 >> 2 & 1);
        this->op[2].is_4op = bVar2;
        this->op[5].is_4op_attached = bVar2;
        bVar2 = (bool)(bVar8 >> 3 & 1);
        this->op[0x12].is_4op = bVar2;
        this->op[0x15].is_4op_attached = bVar2;
        bVar2 = (bool)(bVar8 >> 4 & 1);
        this->op[0x13].is_4op = bVar2;
        this->op[0x16].is_4op_attached = bVar2;
        bVar2 = (bool)(bVar8 >> 5 & 1);
        this->op[0x14].is_4op = bVar2;
        this->op[0x17].is_4op_attached = bVar2;
      }
      else if (idx == 4) {
        if ((char)bVar8 < '\0') {
          this->status = this->status & 0x9f;
        }
        else {
          this->status = '\0';
        }
      }
      break;
    case 2:
    case 3:
      uVar3 = idx + 0xe0U & 0xff;
      if (uVar3 < 0x16 && (idx & 7U) < 6) {
        uVar5 = (ulong)uVar3 + 0x16;
        if (uVar11 == 0) {
          uVar5 = (ulong)uVar3;
        }
        uVar5 = (ulong)""[uVar5];
        BVar9 = uVar5 + 0xee;
        if (uVar11 == 0) {
          BVar9 = uVar5;
        }
        regbase = (Bitu)(uVar3 | uVar11);
        lVar4 = (ulong)(2 < (idx & 7U)) * 9 + uVar5;
        poVar7 = this->op + lVar4;
        change_keepsustain(this,regbase,poVar7);
        this->op[lVar4].vibrato = (bool)(this->adlibreg[regbase + 0x20] >> 6 & 1);
        this->op[lVar4].tremolo = (bool)(this->adlibreg[regbase + 0x20] >> 7);
        if (((this->adlibreg[0x105] & 1) != 0) && (this->op[uVar5].is_4op_attached == true)) {
          BVar9 = BVar9 - 3;
        }
LAB_0033f071:
        change_frequency(this,BVar9,regbase,poVar7);
        return;
      }
      break;
    case 4:
    case 5:
      uVar3 = idx + 0xc0U & 0xff;
      if (uVar3 < 0x16 && (idx & 7U) < 6) {
        uVar5 = (ulong)uVar3 + 0x16;
        if (uVar11 == 0) {
          uVar5 = (ulong)uVar3;
        }
        uVar5 = (ulong)""[uVar5];
        BVar9 = uVar5 + 0xee;
        if (uVar11 == 0) {
          BVar9 = uVar5;
        }
        poVar7 = this->op + (ulong)(2 < (idx & 7U)) * 9 + uVar5;
        regbase = (Bitu)(uVar3 | uVar11);
        if (((this->adlibreg[0x105] & 1) != 0) && (this->op[uVar5].is_4op_attached == true)) {
          BVar9 = BVar9 - 3;
        }
        goto LAB_0033f071;
      }
      break;
    case 6:
    case 7:
      uVar3 = idx + 0xa0U & 0xff;
      if (uVar3 < 0x16 && (~idx & 6U) != 0) {
        uVar5 = (ulong)uVar3 + 0x16;
        if (uVar11 == 0) {
          uVar5 = (ulong)uVar3;
        }
        bVar8 = ""[uVar5];
        change_attackrate(this,(ulong)(uVar3 | uVar11),this->op + bVar8);
        change_decayrate(this,(ulong)(uVar3 | uVar11),this->op + bVar8);
        return;
      }
      break;
    case 8:
    case 9:
      uVar3 = idx & 0xffU ^ 0x80;
      if (uVar3 < 0x16 && (~idx & 6U) != 0) {
        uVar5 = (ulong)uVar3 + 0x16;
        if (uVar11 == 0) {
          uVar5 = (ulong)uVar3;
        }
        bVar8 = ""[uVar5];
        change_releaserate(this,(ulong)(uVar3 | uVar11),this->op + bVar8);
        bVar1 = this->adlibreg[(ulong)(uVar3 | uVar11) + 0x80] >> 4;
        dVar12 = 0.0;
        if (bVar1 != 0xf) {
          dVar12 = exp2((double)bVar1 * -0.5);
        }
        this->op[bVar8].sustain_level = dVar12;
      }
      break;
    case 10:
      uVar3 = idx + 0x60U & 0xff;
      uVar5 = (ulong)uVar3;
      if (uVar3 < 9) {
        uVar6 = uVar5 + 0x12;
        if (uVar11 == 0) {
          uVar6 = uVar5;
        }
        if (((this->adlibreg[0x105] & 1) == 0) || (this->op[uVar6].is_4op_attached == false)) {
          uVar5 = (ulong)(""[uVar5] | uVar11);
          BVar9 = (Bitu)(uVar11 | uVar3);
          change_frequency(this,BVar9,uVar5,this->op + uVar6);
          change_frequency(this,BVar9,uVar5 + 3,this->op + uVar6 + 9);
          if (((this->adlibreg[0x105] & 1) != 0) && (this->op[uVar6].is_4op == true)) {
            change_frequency(this,BVar9,uVar5 + 8,this->op + uVar6 + 3);
            regbase = uVar5 + 0xb;
            poVar7 = this->op + uVar6 + 0xc;
            goto LAB_0033f071;
          }
        }
      }
      break;
    case 0xb:
      if (idx == 0xbd) {
        uVar3 = ~val;
        pDVar10 = this;
        if ((uVar3 & 0x30) == 0) {
          if (this->op[6].act_state == 0) {
            this->op[6].tcount = wavestart[this->wave_sel[0x10]] << 0x10;
            this->op[6].op_state = 0;
            this->op[6].act_state = 2;
          }
          change_frequency(this,6,0x10,this->op + 6);
          if (this->op[0xf].act_state == 0) {
            this->op[0xf].tcount = wavestart[this->wave_sel[0x13]] << 0x10;
            this->op[0xf].op_state = 0;
            this->op[0xf].act_state = 2;
          }
          change_frequency(this,6,0x13,this->op + 0xf);
        }
        else {
          disable_operator(this,this->op + 6,2);
          disable_operator(pDVar10,this->op + 0xf,2);
        }
        if ((uVar3 & 0x28) == 0) {
          if (this->op[0x10].act_state == 0) {
            this->op[0x10].tcount = wavestart[this->wave_sel[0x14]] << 0x10;
            this->op[0x10].op_state = 0;
            this->op[0x10].act_state = 2;
          }
          pDVar10 = this;
          change_frequency(this,7,0x14,this->op + 0x10);
        }
        else {
          disable_operator(pDVar10,this->op + 0x10,2);
        }
        if ((uVar3 & 0x24) == 0) {
          if (this->op[8].act_state == 0) {
            this->op[8].tcount = wavestart[this->wave_sel[0x12]] << 0x10;
            this->op[8].op_state = 0;
            this->op[8].act_state = 2;
          }
          pDVar10 = this;
          change_frequency(this,8,0x12,this->op + 8);
        }
        else {
          disable_operator(pDVar10,this->op + 8,2);
        }
        if ((uVar3 & 0x22) == 0) {
          if (this->op[0x11].act_state == 0) {
            this->op[0x11].tcount = wavestart[this->wave_sel[0x15]] << 0x10;
            this->op[0x11].op_state = 0;
            this->op[0x11].act_state = 2;
          }
          pDVar10 = this;
          change_frequency(this,8,0x15,this->op + 0x11);
        }
        else {
          disable_operator(pDVar10,this->op + 0x11,2);
        }
        poVar7 = this->op + 7;
        if ((uVar3 & 0x21) != 0) {
          disable_operator(pDVar10,poVar7,2);
          return;
        }
        if (this->op[7].act_state == 0) {
          this->op[7].tcount = wavestart[this->wave_sel[0x11]] << 0x10;
          this->op[7].op_state = 0;
          this->op[7].act_state = 2;
        }
        BVar9 = 7;
        regbase = 0x11;
        goto LAB_0033f071;
      }
      uVar3 = idx + 0x50U & 0xff;
      uVar5 = (ulong)uVar3;
      if (uVar3 < 9) {
        uVar6 = uVar5 + 0x12;
        if (uVar11 == 0) {
          uVar6 = uVar5;
        }
        if (((this->adlibreg[0x105] & 1) == 0) || (this->op[uVar6].is_4op_attached == false)) {
          uVar5 = (ulong)(""[uVar5] | uVar11);
          poVar7 = this->op + uVar6;
          if ((val & 0x20U) == 0) {
            pDVar10 = this;
            disable_operator(this,poVar7,1);
            disable_operator(pDVar10,this->op + uVar6 + 9,1);
            if (((this->adlibreg[0x105] & 1) != 0) && (this->op[uVar6].is_4op == true)) {
              disable_operator(pDVar10,this->op + uVar6 + 3,1);
              disable_operator(pDVar10,this->op + uVar6 + 0xc,1);
            }
          }
          else {
            enable_operator(this,uVar5,poVar7,1);
            enable_operator(this,uVar5 + 3,this->op + uVar6 + 9,1);
            if (((this->adlibreg[0x105] & 1) != 0) && (this->op[uVar6].is_4op == true)) {
              enable_operator(this,uVar5 + 8,this->op + uVar6 + 3,1);
              enable_operator(this,uVar5 + 0xb,this->op + uVar6 + 0xc,1);
            }
          }
          BVar9 = (Bitu)(uVar3 | uVar11);
          change_frequency(this,BVar9,uVar5,poVar7);
          change_frequency(this,BVar9,uVar5 + 3,this->op + uVar6 + 9);
          if (((this->adlibreg[0x105] & 1) != 0) && (this->op[uVar6].is_4op == true)) {
            change_frequency(this,BVar9,uVar5 + 8,this->op + uVar6 + 3);
            regbase = uVar5 + 0xb;
            poVar7 = this->op + uVar6 + 0xc;
            goto LAB_0033f071;
          }
        }
      }
      break;
    case 0xc:
      uVar3 = idx + 0x40U & 0xff;
      if (uVar3 < 9) {
        uVar5 = (ulong)uVar3 + 0x12;
        if (uVar11 == 0) {
          uVar5 = (ulong)uVar3;
        }
        change_feedback(this,(ulong)(uVar3 | uVar11),this->op + uVar5);
        if (this->FullPan == false) {
          this->op[uVar5].left_pan = (float)((uint)val >> 4 & 1);
          this->op[uVar5].right_pan = (float)((uint)val >> 5 & 1);
        }
      }
      break;
    case 0xe:
    case 0xf:
      uVar3 = idx + 0x20U & 0xff;
      if (uVar3 < 0x16 && (idx & 7U) < 6) {
        BVar9 = (ulong)uVar3 + 0x16;
        if (uVar11 == 0) {
          BVar9 = (ulong)uVar3;
        }
        this->wave_sel[BVar9] = ((this->adlibreg[0x105] & 1) << 2 | 3) & bVar8;
        change_waveform(this,BVar9,this->op + (ulong)(2 < (idx & 7U)) * 9 + (ulong)""[BVar9]);
        return;
      }
    }
  }
  return;
}

Assistant:

void DBOPL::WriteReg(int idx, int val) {
	Bit32u second_set = (Bit32u)idx&0x100;
	adlibreg[idx] = val;

	switch (idx&0xf0) {
	case ARC_CONTROL:
		// here we check for the second set registers, too:
		switch (idx) {
		case 0x02:	// timer1 counter
		case 0x03:	// timer2 counter
			break;
		case 0x04:
			// IRQ reset, timer mask/start
			if (val&0x80) {
				// clear IRQ bits in status register
				status &= ~0x60;
			} else {
				status = 0;
			}
			break;
#if defined(OPLTYPE_IS_OPL3)
		case 0x04|ARC_SECONDSET:
			// 4op enable/disable switches for each possible channel
			op[0].is_4op = (val&1)>0;
			op[3].is_4op_attached = op[0].is_4op;
			op[1].is_4op = (val&2)>0;
			op[4].is_4op_attached = op[1].is_4op;
			op[2].is_4op = (val&4)>0;
			op[5].is_4op_attached = op[2].is_4op;
			op[18].is_4op = (val&8)>0;
			op[21].is_4op_attached = op[18].is_4op;
			op[19].is_4op = (val&16)>0;
			op[22].is_4op_attached = op[19].is_4op;
			op[20].is_4op = (val&32)>0;
			op[23].is_4op_attached = op[20].is_4op;
			break;
		case 0x05|ARC_SECONDSET:
			break;
#endif
		case 0x08:
			// CSW, note select
			break;
		default:
			break;
		}
		break;
	case ARC_TVS_KSR_MUL:
	case ARC_TVS_KSR_MUL+0x10: {
		// tremolo/vibrato/sustain keeping enabled; key scale rate; frequency multiplication
		int num = (int)idx&7;
		Bitu base = (idx-ARC_TVS_KSR_MUL)&0xff;
		if ((num<6) && (base<22)) {
			Bitu modop = regbase2modop[second_set?(base+22):base];
			Bitu regbase = base+second_set;
			Bitu chanbase = second_set?(modop-18+ARC_SECONDSET):modop;

			// change tremolo/vibrato and sustain keeping of this operator
			op_type* op_ptr = &op[modop+((num<3) ? 0 : 9)];
			change_keepsustain(regbase,op_ptr);
			change_vibrato(regbase,op_ptr);

			// change frequency calculations of this operator as
			// key scale rate and frequency multiplicator can be changed
#if defined(OPLTYPE_IS_OPL3)
			if ((adlibreg[0x105]&1) && (op[modop].is_4op_attached)) {
				// operator uses frequency of channel
				change_frequency(chanbase-3,regbase,op_ptr);
			} else {
				change_frequency(chanbase,regbase,op_ptr);
			}
#else
			change_frequency(chanbase,base,op_ptr);
#endif
		}
		}
		break;
	case ARC_KSL_OUTLEV:
	case ARC_KSL_OUTLEV+0x10: {
		// key scale level; output rate
		int num = (int)idx&7;
		Bitu base = (idx-ARC_KSL_OUTLEV)&0xff;
		if ((num<6) && (base<22)) {
			Bitu modop = regbase2modop[second_set?(base+22):base];
			Bitu chanbase = second_set?(modop-18+ARC_SECONDSET):modop;

			// change frequency calculations of this operator as
			// key scale level and output rate can be changed
			op_type* op_ptr = &op[modop+((num<3) ? 0 : 9)];
#if defined(OPLTYPE_IS_OPL3)
			Bitu regbase = base+second_set;
			if ((adlibreg[0x105]&1) && (op[modop].is_4op_attached)) {
				// operator uses frequency of channel
				change_frequency(chanbase-3,regbase,op_ptr);
			} else {
				change_frequency(chanbase,regbase,op_ptr);
			}
#else
			change_frequency(chanbase,base,op_ptr);
#endif
		}
		}
		break;
	case ARC_ATTR_DECR:
	case ARC_ATTR_DECR+0x10: {
		// attack/decay rates
		int num = (int)idx&7;
		Bitu base = (idx-ARC_ATTR_DECR)&0xff;
		if ((num<6) && (base<22)) {
			Bitu regbase = base+second_set;

			// change attack rate and decay rate of this operator
			op_type* op_ptr = &op[regbase2op[second_set?(base+22):base]];
			change_attackrate(regbase,op_ptr);
			change_decayrate(regbase,op_ptr);
		}
		}
		break;
	case ARC_SUSL_RELR:
	case ARC_SUSL_RELR+0x10: {
		// sustain level; release rate
		int num = (int)idx&7;
		Bitu base = (idx-ARC_SUSL_RELR)&0xff;
		if ((num<6) && (base<22)) {
			Bitu regbase = base+second_set;

			// change sustain level and release rate of this operator
			op_type* op_ptr = &op[regbase2op[second_set?(base+22):base]];
			change_releaserate(regbase,op_ptr);
			change_sustainlevel(regbase,op_ptr);
		}
		}
		break;
	case ARC_FREQ_NUM: {
		// 0xa0-0xa8 low8 frequency
		Bitu base = (idx-ARC_FREQ_NUM)&0xff;
		if (base<9) {
			Bits opbase = second_set?(base+18):base;
#if defined(OPLTYPE_IS_OPL3)
			if ((adlibreg[0x105]&1) && op[opbase].is_4op_attached) break;
#endif
			// regbase of modulator:
			Bits modbase = modulatorbase[base]+second_set;

			Bitu chanbase = base+second_set;

			change_frequency(chanbase,modbase,&op[opbase]);
			change_frequency(chanbase,modbase+3,&op[opbase+9]);
#if defined(OPLTYPE_IS_OPL3)
			// for 4op channels all four operators are modified to the frequency of the channel
			if ((adlibreg[0x105]&1) && op[second_set?(base+18):base].is_4op) {
				change_frequency(chanbase,modbase+8,&op[opbase+3]);
				change_frequency(chanbase,modbase+3+8,&op[opbase+3+9]);
			}
#endif
		}
		}
		break;
	case ARC_KON_BNUM: {
		if (idx == ARC_PERC_MODE) {
#if defined(OPLTYPE_IS_OPL3)
			if (second_set) return;
#endif

			if ((val&0x30) == 0x30) {		// BassDrum active
				enable_operator(16,&op[6],OP_ACT_PERC);
				change_frequency(6,16,&op[6]);
				enable_operator(16+3,&op[6+9],OP_ACT_PERC);
				change_frequency(6,16+3,&op[6+9]);
			} else {
				disable_operator(&op[6],OP_ACT_PERC);
				disable_operator(&op[6+9],OP_ACT_PERC);
			}
			if ((val&0x28) == 0x28) {		// Snare active
				enable_operator(17+3,&op[16],OP_ACT_PERC);
				change_frequency(7,17+3,&op[16]);
			} else {
				disable_operator(&op[16],OP_ACT_PERC);
			}
			if ((val&0x24) == 0x24) {		// TomTom active
				enable_operator(18,&op[8],OP_ACT_PERC);
				change_frequency(8,18,&op[8]);
			} else {
				disable_operator(&op[8],OP_ACT_PERC);
			}
			if ((val&0x22) == 0x22) {		// Cymbal active
				enable_operator(18+3,&op[8+9],OP_ACT_PERC);
				change_frequency(8,18+3,&op[8+9]);
			} else {
				disable_operator(&op[8+9],OP_ACT_PERC);
			}
			if ((val&0x21) == 0x21) {		// Hihat active
				enable_operator(17,&op[7],OP_ACT_PERC);
				change_frequency(7,17,&op[7]);
			} else {
				disable_operator(&op[7],OP_ACT_PERC);
			}

			break;
		}
		// regular 0xb0-0xb8
		Bitu base = (idx-ARC_KON_BNUM)&0xff;
		if (base<9) {
			Bits opbase = second_set?(base+18):base;
#if defined(OPLTYPE_IS_OPL3)
			if ((adlibreg[0x105]&1) && op[opbase].is_4op_attached) break;
#endif
			// regbase of modulator:
			Bits modbase = modulatorbase[base]+second_set;

			if (val&32) {
				// operator switched on
				enable_operator(modbase,&op[opbase],OP_ACT_NORMAL);		// modulator (if 2op)
				enable_operator(modbase+3,&op[opbase+9],OP_ACT_NORMAL);	// carrier (if 2op)
#if defined(OPLTYPE_IS_OPL3)
				// for 4op channels all four operators are switched on
				if ((adlibreg[0x105]&1) && op[opbase].is_4op) {
					// turn on chan+3 operators as well
					enable_operator(modbase+8,&op[opbase+3],OP_ACT_NORMAL);
					enable_operator(modbase+3+8,&op[opbase+3+9],OP_ACT_NORMAL);
				}
#endif
			} else {
				// operator switched off
				disable_operator(&op[opbase],OP_ACT_NORMAL);
				disable_operator(&op[opbase+9],OP_ACT_NORMAL);
#if defined(OPLTYPE_IS_OPL3)
				// for 4op channels all four operators are switched off
				if ((adlibreg[0x105]&1) && op[opbase].is_4op) {
					// turn off chan+3 operators as well
					disable_operator(&op[opbase+3],OP_ACT_NORMAL);
					disable_operator(&op[opbase+3+9],OP_ACT_NORMAL);
				}
#endif
			}

			Bitu chanbase = base+second_set;

			// change frequency calculations of modulator and carrier (2op) as
			// the frequency of the channel has changed
			change_frequency(chanbase,modbase,&op[opbase]);
			change_frequency(chanbase,modbase+3,&op[opbase+9]);
#if defined(OPLTYPE_IS_OPL3)
			// for 4op channels all four operators are modified to the frequency of the channel
			if ((adlibreg[0x105]&1) && op[second_set?(base+18):base].is_4op) {
				// change frequency calculations of chan+3 operators as well
				change_frequency(chanbase,modbase+8,&op[opbase+3]);
				change_frequency(chanbase,modbase+3+8,&op[opbase+3+9]);
			}
#endif
		}
		}
		break;
	case ARC_FEEDBACK: {
		// 0xc0-0xc8 feedback/modulation type (AM/FM)
		Bitu base = (idx-ARC_FEEDBACK)&0xff;
		if (base<9) {
			Bits opbase = second_set?(base+18):base;
			Bitu chanbase = base+second_set;
			change_feedback(chanbase,&op[opbase]);
#if defined(OPLTYPE_IS_OPL3)
			// OPL3 panning
			if (!FullPan)
			{
				op[opbase].left_pan = (float)((val&0x10)>>4);
				op[opbase].right_pan = (float)((val&0x20)>>5);
			}
#endif
		}
		}
		break;
	case ARC_WAVE_SEL:
	case ARC_WAVE_SEL+0x10: {
		int num = (int)idx&7;
		Bitu base = (idx-ARC_WAVE_SEL)&0xff;
		if ((num<6) && (base<22)) {
#if defined(OPLTYPE_IS_OPL3)
			Bits wselbase = second_set?(base+22):base;	// for easier mapping onto wave_sel[]
			// change waveform
			if (adlibreg[0x105]&1) wave_sel[wselbase] = val&7;	// opl3 mode enabled, all waveforms accessible
			else wave_sel[wselbase] = val&3;
			op_type* op_ptr = &op[regbase2modop[wselbase]+((num<3) ? 0 : 9)];
			change_waveform(wselbase,op_ptr);
#else
			if (adlibreg[0x01]&0x20) {
				// wave selection enabled, change waveform
				wave_sel[base] = val&3;
				op_type* op_ptr = &op[regbase2modop[base]+((num<3) ? 0 : 9)];
				change_waveform(base,op_ptr);
			}
#endif
		}
		}
		break;
	default:
		break;
	}
}